

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

void __thiscall FConfigFile::RenameSection(FConfigFile *this,char *oldname,char *newname)

{
  FConfigSection *this_00;
  int iVar1;
  
  this_00 = this->Sections;
  while ((this_00 != (FConfigSection *)0x0 &&
         (iVar1 = strcasecmp((this_00->SectionName).Chars,oldname), iVar1 != 0))) {
    this_00 = this_00->Next;
  }
  if (this_00 != (FConfigSection *)0x0) {
    FString::operator=(&this_00->SectionName,newname);
    return;
  }
  return;
}

Assistant:

void FConfigFile::RenameSection (const char *oldname, const char *newname) const
{
	FConfigSection *section = FindSection(oldname);

	if (section != NULL)
	{
		section->SectionName = newname;
	}
}